

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

void __thiscall wabt::WriteUint128(wabt *this,char *buffer,size_t size,v128 bits)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  char *local_a8;
  size_t truncated_tail;
  char local_98 [4];
  int remainder_buffer_len;
  char remainder_buffer [21];
  int local_74;
  char *pcStack_70;
  int i;
  size_t len;
  char reversed_buffer [40];
  ulong local_38;
  uint64_t remainder;
  uint64_t digits;
  size_t size_local;
  char *buffer_local;
  v128 bits_local;
  
  bits_local.v._0_8_ = bits.v._0_8_;
  pcStack_70 = (char *)0x0;
  buffer_local = (char *)size;
  while( true ) {
    uVar2 = v128::u32((v128 *)&buffer_local,3);
    local_38 = (ulong)uVar2;
    for (local_74 = 3; local_74 != 0; local_74 = local_74 + -1) {
      uVar4 = local_38 / 10;
      uVar2 = v128::u32((v128 *)&buffer_local,local_74 + -1);
      local_38 = (local_38 % 10 << 0x20) + (ulong)uVar2;
      v128::set_u32((v128 *)&buffer_local,local_74,(uint32_t)uVar4);
    }
    v128::set_u32((v128 *)&buffer_local,0,(uint32_t)(local_38 / 10));
    snprintf(local_98,0x15,"%lu",local_38 % 10);
    sVar5 = strlen(local_98);
    iVar3 = (int)sVar5;
    if ((char *)0x27 < pcStack_70 + iVar3) break;
    memcpy((char *)((long)&len + (long)pcStack_70),local_98,(long)iVar3);
    pcStack_70 = pcStack_70 + iVar3;
    bVar1 = v128::is_zero((v128 *)&buffer_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_a8 = (char *)0x0;
      if (buffer <= pcStack_70) {
        local_a8 = pcStack_70 + (1 - (long)buffer);
        pcStack_70 = buffer + -1;
      }
      std::reverse_copy<char*,char*>
                (reversed_buffer + (long)(local_a8 + -8),
                 (char *)((long)&len + (long)pcStack_70) + (long)local_a8,(char *)this);
      this[(long)pcStack_70] = (wabt)0x0;
      return;
    }
  }
  __assert_fail("len + remainder_buffer_len < sizeof(reversed_buffer)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                ,0x32f,"void wabt::WriteUint128(char *, size_t, v128)");
}

Assistant:

void WriteUint128(char* buffer, size_t size, v128 bits) {
  uint64_t digits;
  uint64_t remainder;
  char reversed_buffer[40];
  size_t len = 0;
  do {
    remainder = bits.u32(3);

    for (int i = 3; i != 0; --i) {
      digits = remainder / 10;
      remainder = ((remainder - digits * 10) << 32) + bits.u32(i - 1);
      bits.set_u32(i, digits);
    }

    digits = remainder / 10;
    remainder = remainder - digits * 10;
    bits.set_u32(0, digits);

    char remainder_buffer[21];
    snprintf(remainder_buffer, 21, "%" PRIu64, remainder);
    int remainder_buffer_len = strlen(remainder_buffer);
    assert(len + remainder_buffer_len < sizeof(reversed_buffer));
    memcpy(&reversed_buffer[len], remainder_buffer, remainder_buffer_len);
    len += remainder_buffer_len;
  } while (!bits.is_zero());
  size_t truncated_tail = 0;
  if (len >= size) {
    truncated_tail = len - size + 1;
    len = size - 1;
  }
  std::reverse_copy(reversed_buffer + truncated_tail,
                    reversed_buffer + len + truncated_tail, buffer);
  buffer[len] = '\0';
}